

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O0

int SendDataMDMx(MDM *pMDM,uchar *buf,int buflen,int *pSentBytes)

{
  int iVar1;
  int *pSentBytes_local;
  int buflen_local;
  uchar *buf_local;
  MDM *pMDM_local;
  
  iVar1 = SendDataMDM(pMDM,buf,buflen,pSentBytes);
  return iVar1;
}

Assistant:

HARDWAREX_API int SendDataMDMx(MDM* pMDM, unsigned char* buf, int buflen, int* pSentBytes)
{
	return SendDataMDM(pMDM, buf, buflen, pSentBytes);
}